

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  uint uVar2;
  Vdbe *p;
  Select *p_00;
  Expr *pLeft;
  Expr *pEVar3;
  int iVar4;
  char *pcVar5;
  Op *pOVar6;
  int iVar7;
  int iVar8;
  Op *pOVar9;
  int iVar10;
  SelectDest local_50;
  
  p = pParse->pVdbe;
  p_00 = (pExpr->x).pSelect;
  uVar2 = pExpr->flags;
  iVar4 = 0;
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 >> 0x19 & 1) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",(ulong)p_00->selId);
      sqlite3VdbeAddOp3(p,0xc,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
      return pExpr->iTable;
    }
    pExpr->flags = uVar2 | 0x2000000;
    iVar4 = pParse->nMem + 1;
    pParse->nMem = iVar4;
    (pExpr->y).sub.regReturn = iVar4;
    iVar4 = sqlite3VdbeAddOp3(p,0x46,0,iVar4,0);
    (pExpr->y).sub.iAddr = iVar4 + 1;
    iVar4 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  }
  pcVar5 = "";
  if (iVar4 == 0) {
    pcVar5 = "CORRELATED ";
  }
  iVar10 = 1;
  sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar5,(ulong)p_00->selId);
  uVar1 = pExpr->op;
  if (uVar1 == 0x83) {
    iVar10 = p_00->pEList->nExpr;
  }
  local_50.iSDParm = pParse->nMem + 1;
  iVar8 = pParse->nMem + iVar10;
  local_50.iSdst = 0;
  local_50.nSdst = 0;
  local_50.zAffSdst = (char *)0x0;
  pParse->nMem = iVar8;
  if (uVar1 == 0x83) {
    local_50.nSdst = iVar10;
    local_50.iSdst = local_50.iSDParm;
    sqlite3VdbeAddOp3(p,0x49,0,local_50.iSDParm,iVar8);
    local_50.eDest = '\n';
  }
  else {
    sqlite3VdbeAddOp3(p,0x46,0,local_50.iSDParm,0);
    local_50.eDest = '\x03';
  }
  pLeft = sqlite3ExprAlloc(pParse->db,0x93,sqlite3IntTokens + 1,0);
  pEVar3 = p_00->pLimit;
  if (pEVar3 == (Expr *)0x0) {
    pEVar3 = sqlite3PExpr(pParse,0x8d,pLeft,(Expr *)0x0);
    p_00->pLimit = pEVar3;
  }
  else {
    if (pEVar3->pLeft != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pEVar3->pLeft);
      pEVar3 = p_00->pLimit;
    }
    pEVar3->pLeft = pLeft;
  }
  p_00->iLimit = 0;
  iVar8 = sqlite3Select(pParse,p_00,&local_50);
  iVar10 = 0;
  if ((iVar8 == 0) && (pExpr->iTable = local_50.iSDParm, iVar10 = local_50.iSDParm, iVar4 != 0)) {
    pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      iVar8 = p->nOp + -1;
      if (-1 < iVar4) {
        iVar8 = iVar4;
      }
      pOVar6 = p->aOp + iVar8;
    }
    pOVar6->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x42,(pExpr->y).sub.regReturn,0,0);
    iVar4 = p->nOp + -1;
    if (p->db->mallocFailed == '\0') {
      iVar8 = (pExpr->y).sub.iAddr;
      iVar7 = iVar8 + -1;
      if (iVar8 < 1) {
        iVar7 = iVar4;
      }
      pOVar9 = p->aOp + iVar7;
    }
    pOVar9->p1 = iVar4;
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(Parse *pParse, Expr *pExpr){
  int addrOnce = 0;           /* Address of OP_Once at top of subroutine */
  int rReg = 0;               /* Register storing resulting */
  Select *pSel;               /* SELECT statement to encode */
  SelectDest dest;            /* How to deal with SELECT result */
  int nReg;                   /* Registers to allocate */
  Expr *pLimit;               /* New limit expression */

  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  testcase( pExpr->op==TK_EXISTS );
  testcase( pExpr->op==TK_SELECT );
  assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
  assert( ExprHasProperty(pExpr, EP_xIsSelect) );
  pSel = pExpr->x.pSelect;

  /* The evaluation of the EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    /* If this routine has already been coded, then invoke it as a
    ** subroutine. */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      ExplainQueryPlan((pParse, 0, "REUSE SUBQUERY %d", pSel->selId));
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      return pExpr->iTable;
    }

    /* Begin coding the subroutine */
    ExprSetProperty(pExpr, EP_Subrtn);
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pExpr->y.sub.regReturn) + 1;
    VdbeComment((v, "return address"));

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }
  
  /* For a SELECT, generate code to put the values for all columns of
  ** the first row into an array of registers and return the index of
  ** the first register.
  **
  ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
  ** into a register and return that register number.
  **
  ** In both cases, the query is augmented with "LIMIT 1".  Any 
  ** preexisting limit is discarded in place of the new LIMIT 1.
  */
  ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSel->selId));
  nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
  sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
  pParse->nMem += nReg;
  if( pExpr->op==TK_SELECT ){
    dest.eDest = SRT_Mem;
    dest.iSdst = dest.iSDParm;
    dest.nSdst = nReg;
    sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
    VdbeComment((v, "Init subquery result"));
  }else{
    dest.eDest = SRT_Exists;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
    VdbeComment((v, "Init EXISTS result"));
  }
  pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
  if( pSel->pLimit ){
    sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
    pSel->pLimit->pLeft = pLimit;
  }else{
    pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
  }
  pSel->iLimit = 0;
  if( sqlite3Select(pParse, pSel, &dest) ){
    return 0;
  }
  pExpr->iTable = rReg = dest.iSDParm;
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);

    /* Subroutine return */
    sqlite3VdbeAddOp1(v, OP_Return, pExpr->y.sub.regReturn);
    sqlite3VdbeChangeP1(v, pExpr->y.sub.iAddr-1, sqlite3VdbeCurrentAddr(v)-1);
  }

  return rReg;
}